

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aho-corasick-lite.cpp
# Opt level: O0

void __thiscall Trie::Trie(Trie *this)

{
  trie_node_t *ptVar1;
  trie_node_s *in_RDI;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1169c0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1169d3);
  ptVar1 = (trie_node_t *)operator_new(0x40);
  trie_node_s::trie_node_s(in_RDI);
  in_RDI->search_clue = ptVar1;
  in_RDI->infoIndex = 0;
  return;
}

Assistant:

Trie::Trie()
{
	root = new trie_node_t;
	size = 0;
}